

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_attr_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,AttrMeta *meta,uint32_t indent)

{
  bool bVar1;
  value_type *pvVar2;
  value_type_conflict1 *pvVar3;
  string *psVar4;
  tinyusdz *ptVar5;
  value_type *pvVar6;
  value_type *this_00;
  value_type_conflict2 *pvVar7;
  value_type *pvVar8;
  optional<tinyusdz::Interpolation> *poVar9;
  ostream *poVar10;
  bool v;
  uint32_t n;
  Interpolation interp;
  uint32_t n_00;
  uint32_t v_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t n_04;
  uint32_t n_05;
  uint32_t n_06;
  uint32_t n_07;
  uint32_t n_08;
  uint32_t n_09;
  uint32_t n_10;
  uint32_t n_11;
  token *v_01;
  token *v_02;
  token *v_03;
  token *v_04;
  StringData *v_05;
  StringData *v_06;
  char *this_01;
  string local_770;
  string local_750;
  reference local_730;
  StringData *item_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *__range1_1;
  reference local_6f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_conflict
  *item;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  *__range1;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  allocator local_5c1;
  string local_5c0;
  string local_5a0;
  string local_580;
  allocator local_559;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  allocator local_4d1;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  allocator local_449;
  string local_448;
  string local_428;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  allocator local_379;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  allocator local_229;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream aoStack_198 [380];
  uint local_1c;
  optional<tinyusdz::Interpolation> *poStack_18;
  uint32_t indent_local;
  AttrMeta *meta_local;
  
  local_1c = (uint)meta;
  poStack_18 = (optional<tinyusdz::Interpolation> *)this;
  meta_local = (AttrMeta *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)poStack_18);
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_1c8,(pprint *)(ulong)local_1c,n);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_1c8);
    poVar10 = ::std::operator<<(poVar10,"interpolation = ");
    pvVar2 = nonstd::optional_lite::optional<tinyusdz::Interpolation>::value(poStack_18);
    to_string_abi_cxx11_(&local_208,(tinyusdz *)(ulong)*pvVar2,interp);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_228,"\"",&local_229);
    quote(&local_1e8,&local_208,&local_228);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_1e8);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_1e8);
    ::std::__cxx11::string::~string((string *)&local_228);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_229);
    ::std::__cxx11::string::~string((string *)&local_208);
    ::std::__cxx11::string::~string((string *)&local_1c8);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 1));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_250,(pprint *)(ulong)local_1c,n_00);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_250);
    poVar10 = ::std::operator<<(poVar10,"elementSize = ");
    pvVar3 = nonstd::optional_lite::optional<unsigned_int>::value
                       ((optional<unsigned_int> *)(poStack_18 + 1));
    to_string_abi_cxx11_(&local_270,(tinyusdz *)(ulong)*pvVar3,v_00);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_270);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_270);
    ::std::__cxx11::string::~string((string *)&local_250);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x33));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_290,(pprint *)(ulong)local_1c,n_01);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_290);
    poVar10 = ::std::operator<<(poVar10,"bindMaterialAs = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(poStack_18 + 0x33));
    to_string_abi_cxx11_(&local_2d0,ptVar5,v_01);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2f0,"\"",&local_2f1);
    quote(&local_2b0,&local_2d0,&local_2f0);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_2b0);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_2b0);
    ::std::__cxx11::string::~string((string *)&local_2f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    ::std::__cxx11::string::~string((string *)&local_290);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x13));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_318,(pprint *)(ulong)local_1c,n_02);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_318);
    poVar10 = ::std::operator<<(poVar10,"connectability = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(poStack_18 + 0x13));
    to_string_abi_cxx11_(&local_358,ptVar5,v_02);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_378,"\"",&local_379);
    quote(&local_338,&local_358,&local_378);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_338);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_338);
    ::std::__cxx11::string::~string((string *)&local_378);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
    ::std::__cxx11::string::~string((string *)&local_358);
    ::std::__cxx11::string::~string((string *)&local_318);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x29));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_3a0,(pprint *)(ulong)local_1c,n_03);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_3a0);
    poVar10 = ::std::operator<<(poVar10,"displayName = ");
    psVar4 = (string *)
             nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(poStack_18 + 0x29));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3e0,"\"",&local_3e1);
    quote(&local_3c0,psVar4,&local_3e0);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_3c0);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_3c0);
    ::std::__cxx11::string::~string((string *)&local_3e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    ::std::__cxx11::string::~string((string *)&local_3a0);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x2e));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_408,(pprint *)(ulong)local_1c,n_04);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_408);
    poVar10 = ::std::operator<<(poVar10,"displayGroup = ");
    psVar4 = (string *)
             nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(poStack_18 + 0x2e));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_448,"\"",&local_449);
    quote(&local_428,psVar4,&local_448);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_428);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_428);
    ::std::__cxx11::string::~string((string *)&local_448);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_449);
    ::std::__cxx11::string::~string((string *)&local_408);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x18));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_470,(pprint *)(ulong)local_1c,n_05);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_470);
    poVar10 = ::std::operator<<(poVar10,"outputName = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(poStack_18 + 0x18));
    to_string_abi_cxx11_(&local_4b0,ptVar5,v_03);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4d0,"\"",&local_4d1);
    quote(&local_490,&local_4b0,&local_4d0);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_490);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_490);
    ::std::__cxx11::string::~string((string *)&local_4d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
    ::std::__cxx11::string::~string((string *)&local_4b0);
    ::std::__cxx11::string::~string((string *)&local_470);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x1d));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_4f8,(pprint *)(ulong)local_1c,n_06);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_4f8);
    poVar10 = ::std::operator<<(poVar10,"renderType = ");
    ptVar5 = (tinyusdz *)
             nonstd::optional_lite::optional<tinyusdz::Token>::value
                       ((optional<tinyusdz::Token> *)(poStack_18 + 0x1d));
    to_string_abi_cxx11_(&local_538,ptVar5,v_04);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_558,"\"",&local_559);
    quote(&local_518,&local_538,&local_558);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_518);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_518);
    ::std::__cxx11::string::~string((string *)&local_558);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_559);
    ::std::__cxx11::string::~string((string *)&local_538);
    ::std::__cxx11::string::~string((string *)&local_4f8);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x22));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_580,(pprint *)(ulong)local_1c,n_07);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_580);
    pvVar8 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(poStack_18 + 0x22));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5c0,"sdrMetadata",&local_5c1);
    print_customData(&local_5a0,pvVar8,&local_5c0,local_1c);
    ::std::operator<<(poVar10,(string *)&local_5a0);
    ::std::__cxx11::string::~string((string *)&local_5a0);
    ::std::__cxx11::string::~string((string *)&local_5c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    ::std::__cxx11::string::~string((string *)&local_580);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 2));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_5e8,(pprint *)(ulong)local_1c,n_08);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_5e8);
    poVar10 = ::std::operator<<(poVar10,"hidden = ");
    pvVar6 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(poStack_18 + 2));
    to_string_abi_cxx11_(&local_608,(tinyusdz *)(ulong)(*pvVar6 & 1),v);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_608);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_608);
    ::std::__cxx11::string::~string((string *)&local_5e8);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 3));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_628,(pprint *)(ulong)local_1c,n_09);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_628);
    poVar10 = ::std::operator<<(poVar10,"comment = ");
    this_00 = nonstd::optional_lite::optional<tinyusdz::value::StringData>::value
                        ((optional<tinyusdz::value::StringData> *)(poStack_18 + 3));
    to_string_abi_cxx11_(&local_648,(tinyusdz *)this_00,v_05);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_648);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_648);
    ::std::__cxx11::string::~string((string *)&local_628);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 0x11));
  if (bVar1) {
    pprint::Indent_abi_cxx11_(&local_668,(pprint *)(ulong)local_1c,n_10);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_668);
    this_01 = "weight = ";
    poVar10 = ::std::operator<<(poVar10,"weight = ");
    pvVar7 = nonstd::optional_lite::optional<double>::value((optional<double> *)(poStack_18 + 0x11))
    ;
    (anonymous_namespace)::dtos_abi_cxx11_(&local_688,(_anonymous_namespace_ *)this_01,*pvVar7);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_688);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_688);
    ::std::__cxx11::string::~string((string *)&local_668);
  }
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)(poStack_18 + 10));
  if (bVar1) {
    pvVar8 = nonstd::optional_lite::
             optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
             ::value((optional<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
                      *)(poStack_18 + 10));
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_6c8,"customData",(allocator *)((long)&__range1 + 7));
    print_customData(&local_6a8,pvVar8,&local_6c8,local_1c);
    ::std::operator<<(aoStack_198,(string *)&local_6a8);
    ::std::__cxx11::string::~string((string *)&local_6a8);
    ::std::__cxx11::string::~string((string *)&local_6c8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  }
  poVar9 = poStack_18 + 0x38;
  __end1 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                    *)poVar9);
  item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                   *)poVar9);
  while (bVar1 = ::std::operator!=(&__end1,(_Self *)&item), bVar1) {
    local_6f0 = ::std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
                ::operator*(&__end1);
    print_meta((string *)&__range1_1,&local_6f0->second,local_1c,false,(string *)local_6f0);
    ::std::operator<<(aoStack_198,(string *)&__range1_1);
    ::std::__cxx11::string::~string((string *)&__range1_1);
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>
    ::operator++(&__end1);
  }
  poVar9 = poStack_18 + 0x3e;
  __end1_1._M_current =
       (StringData *)
       std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::begin
                 ((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                   *)poVar9);
  item_1 = (StringData *)
           std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
           end((vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *)
               poVar9);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_tinyusdz::value::StringData_*,_std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>_>
                             *)&item_1), bVar1) {
    local_730 = __gnu_cxx::
                __normal_iterator<const_tinyusdz::value::StringData_*,_std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>_>
                ::operator*(&__end1_1);
    pprint::Indent_abi_cxx11_(&local_750,(pprint *)(ulong)local_1c,n_11);
    poVar10 = ::std::operator<<(aoStack_198,(string *)&local_750);
    to_string_abi_cxx11_(&local_770,(tinyusdz *)local_730,v_06);
    poVar10 = ::std::operator<<(poVar10,(string *)&local_770);
    ::std::operator<<(poVar10,"\n");
    ::std::__cxx11::string::~string((string *)&local_770);
    ::std::__cxx11::string::~string((string *)&local_750);
    __gnu_cxx::
    __normal_iterator<const_tinyusdz::value::StringData_*,_std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>_>
    ::operator++(&__end1_1);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_attr_metas(const AttrMeta &meta, const uint32_t indent) {
  std::stringstream ss;

  if (meta.interpolation) {
    ss << pprint::Indent(indent)
       << "interpolation = " << quote(to_string(meta.interpolation.value()))
       << "\n";
  }

  if (meta.elementSize) {
    ss << pprint::Indent(indent)
       << "elementSize = " << to_string(meta.elementSize.value()) << "\n";
  }

  if (meta.bindMaterialAs) {
    ss << pprint::Indent(indent)
       << "bindMaterialAs = " << quote(to_string(meta.bindMaterialAs.value()))
       << "\n";
  }

  if (meta.connectability) {
    ss << pprint::Indent(indent)
       << "connectability = " << quote(to_string(meta.connectability.value()))
       << "\n";
  }

  if (meta.displayName) {
    ss << pprint::Indent(indent)
       << "displayName = " << quote(meta.displayName.value()) << "\n";
  }

  if (meta.displayGroup) {
    ss << pprint::Indent(indent)
       << "displayGroup = " << quote(meta.displayGroup.value()) << "\n";
  }

  if (meta.outputName) {
    ss << pprint::Indent(indent)
       << "outputName = " << quote(to_string(meta.outputName.value())) << "\n";
  }

  if (meta.renderType) {
    ss << pprint::Indent(indent)
       << "renderType = " << quote(to_string(meta.renderType.value())) << "\n";
  }

  if (meta.sdrMetadata) {
    ss << pprint::Indent(indent)
       << print_customData(meta.sdrMetadata.value(), "sdrMetadata", indent);
  }

  if (meta.hidden) {
    ss << pprint::Indent(indent)
       << "hidden = " << to_string(meta.hidden.value()) << "\n";
  }

  if (meta.comment) {
    ss << pprint::Indent(indent)
       << "comment = " << to_string(meta.comment.value()) << "\n";
  }

  if (meta.weight) {
    ss << pprint::Indent(indent) << "weight = " << dtos(meta.weight.value())
       << "\n";
  }

  if (meta.customData) {
    ss << print_customData(meta.customData.value(), "customData", indent);
  }

  // other user defined metadataum.
  for (const auto &item : meta.meta) {
    // attribute meta does not emit type_name
    ss << print_meta(item.second, indent, /* emit_type_name */false, item.first);
  }

  for (const auto &item : meta.stringData) {
    ss << pprint::Indent(indent) << to_string(item) << "\n";
  }

  return ss.str();
}